

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::CacheState::barrier
          (CacheState *this,VkPipelineStageFlags srcStages,VkAccessFlags srcAccesses,
          VkPipelineStageFlags dstStages,VkAccessFlags dstAccesses)

{
  VkAccessFlags (*__src) [15];
  uint *puVar1;
  VkPipelineStageFlagBits VVar2;
  VkPipelineStageFlagBits VVar3;
  PipelineStage PVar4;
  PipelineStage PVar5;
  PipelineStage PVar6;
  uint uVar7;
  VkPipelineStageFlags dstStage_;
  VkPipelineStageFlagBits VVar8;
  VkPipelineStageFlags sharedStage_;
  VkPipelineStageFlagBits flags;
  bool bVar9;
  bool oldUnavailableLayoutTransition [15];
  VkPipelineStageFlags oldIncompleteOperations [15];
  VkAccessFlags oldUnavailableWriteOperations [15] [15];
  
  oldIncompleteOperations._0_8_ = *(undefined8 *)this->m_incompleteOperations;
  oldIncompleteOperations._8_8_ = *(undefined8 *)(this->m_incompleteOperations + 2);
  oldIncompleteOperations._16_8_ = *(undefined8 *)(this->m_incompleteOperations + 4);
  oldIncompleteOperations._24_8_ = *(undefined8 *)(this->m_incompleteOperations + 6);
  oldIncompleteOperations._32_8_ = *(undefined8 *)(this->m_incompleteOperations + 8);
  oldIncompleteOperations._52_8_ = *(undefined8 *)(this->m_incompleteOperations + 0xd);
  oldIncompleteOperations[10] =
       (VkPipelineStageFlags)*(undefined8 *)(this->m_incompleteOperations + 10);
  oldIncompleteOperations[0xb] =
       (VkPipelineStageFlags)*(undefined8 *)(this->m_incompleteOperations + 0xb);
  oldIncompleteOperations[0xc] =
       (VkPipelineStageFlags)((ulong)*(undefined8 *)(this->m_incompleteOperations + 0xb) >> 0x20);
  __src = this->m_unavailableWriteOperations;
  memcpy(oldUnavailableWriteOperations,__src,900);
  oldUnavailableLayoutTransition._8_7_ =
       (undefined7)((ulong)*(undefined8 *)(this->m_unavailableLayoutTransition + 7) >> 8);
  oldUnavailableLayoutTransition._0_7_ =
       (undefined7)*(undefined8 *)this->m_unavailableLayoutTransition;
  oldUnavailableLayoutTransition[7] =
       SUB81((ulong)*(undefined8 *)this->m_unavailableLayoutTransition >> 0x38,0);
  VVar2 = this->m_allowedStages;
  for (VVar3 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; VVar3 <= srcStages; VVar3 = VVar3 * 2) {
    if ((VVar3 & srcStages) != 0) {
      PVar4 = pipelineStageFlagToPipelineStage(VVar3);
      for (VVar8 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; VVar8 <= dstStages; VVar8 = VVar8 * 2) {
        if ((VVar8 & dstStages) != 0) {
          PVar5 = pipelineStageFlagToPipelineStage(VVar8);
          this->m_incompleteOperations[PVar5] =
               this->m_incompleteOperations[PVar5] & oldIncompleteOperations[PVar4];
          this->m_unavailableLayoutTransition[PVar5] =
               (bool)(this->m_unavailableLayoutTransition[PVar5] &
                     oldUnavailableLayoutTransition[PVar4]);
          for (flags = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; flags <= VVar2; flags = flags * 2) {
            if ((VVar2 & flags) != 0) {
              PVar6 = pipelineStageFlagToPipelineStage(flags);
              puVar1 = (uint *)((long)__src[PVar5] + (ulong)(PVar6 << 2));
              *puVar1 = *puVar1 & *(uint *)((long)oldUnavailableWriteOperations[PVar4] +
                                           (ulong)(PVar6 << 2));
            }
          }
        }
      }
    }
  }
  for (VVar3 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; VVar3 <= dstStages; VVar3 = VVar3 * 2) {
    if ((VVar3 & dstStages) != 0) {
      PVar4 = pipelineStageFlagToPipelineStage(VVar3);
      this->m_incompleteOperations[PVar4] = this->m_incompleteOperations[PVar4] & ~srcStages;
      bVar9 = true;
      for (VVar8 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; VVar8 <= VVar2; VVar8 = VVar8 * 2) {
        if ((VVar2 & VVar8) != 0) {
          PVar5 = pipelineStageFlagToPipelineStage(VVar8);
          uVar7 = __src[PVar4][PVar5];
          if ((srcStages & VVar8) != 0) {
            uVar7 = uVar7 & ~srcAccesses;
            __src[PVar4][PVar5] = uVar7;
          }
          bVar9 = (bool)(bVar9 & uVar7 == 0);
        }
      }
      if (bVar9) {
        this->m_invisibleOperations[PVar4] = this->m_invisibleOperations[PVar4] & ~dstAccesses;
      }
    }
  }
  return;
}

Assistant:

void CacheState::barrier (vk::VkPipelineStageFlags	srcStages,
						  vk::VkAccessFlags			srcAccesses,
						  vk::VkPipelineStageFlags	dstStages,
						  vk::VkAccessFlags			dstAccesses)
{
	DE_ASSERT((srcStages & (~m_allowedStages)) == 0);
	DE_ASSERT((srcAccesses & (~m_allowedAccesses)) == 0);
	DE_ASSERT((dstStages & (~m_allowedStages)) == 0);
	DE_ASSERT((dstAccesses & (~m_allowedAccesses)) == 0);

	// Transitivity
	{
		vk::VkPipelineStageFlags		oldIncompleteOperations[PIPELINESTAGE_LAST];
		vk::VkAccessFlags				oldUnavailableWriteOperations[PIPELINESTAGE_LAST][PIPELINESTAGE_LAST];
		bool							oldUnavailableLayoutTransition[PIPELINESTAGE_LAST];

		deMemcpy(oldIncompleteOperations, m_incompleteOperations, sizeof(oldIncompleteOperations));
		deMemcpy(oldUnavailableWriteOperations, m_unavailableWriteOperations, sizeof(oldUnavailableWriteOperations));
		deMemcpy(oldUnavailableLayoutTransition, m_unavailableLayoutTransition, sizeof(oldUnavailableLayoutTransition));

		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= srcStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & srcStages) == 0)
				continue;

			for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= dstStages; dstStage_ <<= 1)
			{
				const PipelineStage	dstStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

				if ((dstStage_ & dstStages) == 0)
					continue;

				// Stages that have completed before srcStage have also completed before dstStage
				m_incompleteOperations[dstStage] &= oldIncompleteOperations[srcStage];

				// Image layout transition in srcStage are now available in dstStage
				m_unavailableLayoutTransition[dstStage] &= oldUnavailableLayoutTransition[srcStage];

				for (vk::VkPipelineStageFlags sharedStage_ = 1; sharedStage_ <= m_allowedStages; sharedStage_ <<= 1)
				{
					const PipelineStage	sharedStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)sharedStage_);

					if ((sharedStage_ & m_allowedStages) == 0)
						continue;

					// Writes that are available in srcStage are also available in dstStage
					m_unavailableWriteOperations[dstStage][sharedStage] &= oldUnavailableWriteOperations[srcStage][sharedStage];
				}
			}
		}
	}

	// Barrier
	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= dstStages; dstStage_ <<= 1)
	{
		const PipelineStage	dstStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);
		bool				allWritesAvailable	= true;

		if ((dstStage_ & dstStages) == 0)
			continue;

		// Operations in srcStages have completed before any stage in dstStages
		m_incompleteOperations[dstStage] &= ~srcStages;

		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= m_allowedStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & m_allowedStages) == 0)
				continue;

			// Make srcAccesses from srcStage available in dstStage
			if ((srcStage_ & srcStages) != 0)
				m_unavailableWriteOperations[dstStage][srcStage] &= ~srcAccesses;

			if (m_unavailableWriteOperations[dstStage][srcStage] != 0)
				allWritesAvailable = false;
		}

		// If all writes are available in dstStage make dstAccesses also visible
		if (allWritesAvailable)
			m_invisibleOperations[dstStage] &= ~dstAccesses;
	}
}